

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

bool wasm_memory_grow(wasm_memory_t *memory,wasm_memory_pages_t delta)

{
  Result RVar1;
  Memory *this;
  
  this = wasm_ref_t::As<wabt::interp::Memory>((wasm_ref_t *)memory);
  RVar1 = wabt::interp::Memory::Grow(this,delta);
  return RVar1.enum_ == Ok;
}

Assistant:

bool wasm_memory_grow(wasm_memory_t* memory, wasm_memory_pages_t delta) {
  return Succeeded(memory->As<Memory>()->Grow(delta));
}